

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collision.cpp
# Opt level: O2

void __thiscall
CCollision::MoveBox(CCollision *this,vec2 *pInoutPos,vec2 *pInoutVel,vec2 Size,float Elasticity,
                   bool *pDeath)

{
  vec2 Pos;
  vec2 Pos_00;
  vec2 Pos_01;
  vec2 Pos_02;
  vec2 Size_00;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  float fVar5;
  float fVar6;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar7;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aVar8;
  float fVar9;
  float fVar10;
  anon_union_4_2_94730284_for_vector2_base<float>_1 aVar11;
  float local_d0;
  anon_union_4_2_94730284_for_vector2_base<float>_1 local_c8;
  anon_union_4_2_947302a4_for_vector2_base<float>_3 aStack_c4;
  
  _local_c8 = *pInoutPos;
  local_d0 = (pInoutVel->field_0).x;
  fVar9 = (pInoutVel->field_1).y;
  fVar5 = SQRT(local_d0 * local_d0 + fVar9 * fVar9);
  if (pDeath != (bool *)0x0) {
    *pDeath = false;
  }
  if (1e-05 < fVar5) {
    iVar3 = (int)fVar5;
    fVar5 = -Elasticity;
    fVar10 = 1.0 / (float)(iVar3 + 1);
    for (iVar4 = 0; iVar4 <= iVar3; iVar4 = iVar4 + 1) {
      aVar11.x = fVar10 * local_d0 + local_c8.x;
      aVar7.y = aStack_c4.y + fVar10 * fVar9;
      if ((pDeath != (bool *)0x0) &&
         (Pos_02.field_1.y = aVar7.y, Pos_02.field_0.x = aVar11.x,
         Size_00.field_1.y = Size.field_1.y * 0.6666667,
         Size_00.field_0.x = Size.field_0.x * 0.6666667, bVar1 = TestBox(this,Pos_02,Size_00,2),
         bVar1)) {
        *pDeath = true;
      }
      Pos.field_1.y = aVar7.y;
      Pos.field_0.x = aVar11.x;
      bVar1 = TestBox(this,Pos,Size,1);
      if (bVar1) {
        Pos_00.field_1.y = aVar7.y;
        Pos_00.field_0.x = local_c8.x;
        bVar1 = TestBox(this,Pos_00,Size,1);
        aVar8 = aStack_c4;
        if (!bVar1) {
          aVar8.y = aVar7.y;
        }
        fVar6 = fVar9 * fVar5;
        Pos_01.field_1.y = aStack_c4.y;
        Pos_01.field_0.x = aVar11.x;
        bVar2 = TestBox(this,Pos_01,Size,1);
        if (bVar2) {
          if (!bVar1) {
            fVar6 = fVar9;
          }
          local_d0 = local_d0 * fVar5;
          aStack_c4.y = aVar8.y;
        }
        else if (bVar1) {
          local_c8.x = aVar11.x;
        }
        else {
          local_d0 = local_d0 * fVar5;
        }
      }
      else {
        aStack_c4.y = aVar7.y;
        local_c8.x = aVar11.x;
        fVar6 = fVar9;
      }
      fVar9 = fVar6;
    }
  }
  *pInoutPos = _local_c8;
  (pInoutVel->field_0).x = local_d0;
  (pInoutVel->field_1).y = fVar9;
  return;
}

Assistant:

void CCollision::MoveBox(vec2 *pInoutPos, vec2 *pInoutVel, vec2 Size, float Elasticity, bool *pDeath) const
{
	// do the move
	vec2 Pos = *pInoutPos;
	vec2 Vel = *pInoutVel;

	const float Distance = length(Vel);
	const int Max = (int)Distance;

	if(pDeath)
		*pDeath = false;

	if(Distance > 0.00001f)
	{
		const float Fraction = 1.0f/(Max+1);
		for(int i = 0; i <= Max; i++)
		{
			vec2 NewPos = Pos + Vel*Fraction; // TODO: this row is not nice

			//You hit a deathtile, congrats to that :)
			//Deathtiles are a bit smaller
			if(pDeath && TestBox(vec2(NewPos.x, NewPos.y), Size*(2.0f/3.0f), COLFLAG_DEATH))
			{
				*pDeath = true;
			}

			if(TestBox(vec2(NewPos.x, NewPos.y), Size))
			{
				int Hits = 0;

				if(TestBox(vec2(Pos.x, NewPos.y), Size))
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					Hits++;
				}

				if(TestBox(vec2(NewPos.x, Pos.y), Size))
				{
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
					Hits++;
				}

				// neither of the tests got a collision.
				// this is a real _corner case_!
				if(Hits == 0)
				{
					NewPos.y = Pos.y;
					Vel.y *= -Elasticity;
					NewPos.x = Pos.x;
					Vel.x *= -Elasticity;
				}
			}

			Pos = NewPos;
		}
	}

	*pInoutPos = Pos;
	*pInoutVel = Vel;
}